

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::garbageCollect(Solver *this)

{
  uint *__ptr;
  RegionAllocator<unsigned_int> local_28;
  
  local_28.memory = (uint *)0x0;
  local_28.sz = 0;
  local_28.cap = 0;
  local_28.wasted_ = 0;
  RegionAllocator<unsigned_int>::capacity
            (&local_28,
             (this->ca).super_RegionAllocator<unsigned_int>.sz -
             (this->ca).super_RegionAllocator<unsigned_int>.wasted_);
  local_28._20_1_ = 0;
  relocAll(this,(ClauseAllocator *)&local_28);
  if (1 < this->verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->ca).super_RegionAllocator<unsigned_int>.sz << 2),(ulong)(local_28.sz << 2)
          );
  }
  (this->ca).super_RegionAllocator<unsigned_int>.field_0x14 = local_28._20_1_;
  __ptr = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  (this->ca).super_RegionAllocator<unsigned_int>.memory = local_28.memory;
  (this->ca).super_RegionAllocator<unsigned_int>.sz = local_28.sz;
  (this->ca).super_RegionAllocator<unsigned_int>.cap = local_28.cap;
  (this->ca).super_RegionAllocator<unsigned_int>.wasted_ = local_28.wasted_;
  return;
}

Assistant:

void Solver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}